

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_color(rf_image *__return_storage_ptr__,int width,int height,rf_color color,
                  rf_allocator allocator)

{
  int iVar1;
  int iVar2;
  rf_image local_80;
  undefined8 local_68;
  long local_60;
  undefined4 local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  rf_color *local_38;
  void *dst;
  int local_28;
  int dst_size;
  int height_local;
  int width_local;
  rf_allocator allocator_local;
  rf_color color_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  _height_local = allocator.user_data;
  local_28 = height;
  dst_size = width;
  allocator_local.allocator_proc._4_4_ = color;
  memset(__return_storage_ptr__,0,0x18);
  iVar1 = dst_size * local_28;
  iVar2 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  dst._4_4_ = iVar1 * iVar2;
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  local_48 = "rf_gen_image_color";
  local_40 = 0x4186;
  local_68 = 0;
  local_60 = (long)dst._4_4_;
  local_58 = 0;
  local_38 = (rf_color *)(*(code *)allocator_local.user_data)(&height_local,1);
  if (local_38 != (rf_color *)0x0) {
    rf_gen_image_color_to_buffer
              (&local_80,dst_size,local_28,allocator_local.allocator_proc._4_4_,local_38,
               (long)(dst_size * local_28));
    __return_storage_ptr__->data = local_80.data;
    __return_storage_ptr__->width = local_80.width;
    __return_storage_ptr__->height = local_80.height;
    __return_storage_ptr__->format = local_80.format;
    __return_storage_ptr__->valid = local_80.valid;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_80._21_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_color(int width, int height, rf_color color, rf_allocator allocator)
{
    rf_image result = {0};

    int dst_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
    void* dst = RF_ALLOC(allocator, dst_size);

    if (dst)
    {
        result = rf_gen_image_color_to_buffer(width, height, color, dst, width * height);
    }

    return result;
}